

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assert.cpp
# Opt level: O0

void idx2::AbortHandler(int Signum)

{
  undefined1 local_30 [8];
  printer Pr;
  cstr Name;
  int Signum_local;
  
  Pr.File = (FILE *)0x0;
  switch(Signum) {
  case 4:
    Pr.File = (FILE *)anon_var_dwarf_f708;
    break;
  case 6:
    Pr.File = (FILE *)anon_var_dwarf_f6c5;
    break;
  case 7:
    Pr.File = (FILE *)anon_var_dwarf_f6f2;
    break;
  case 8:
    Pr.File = (FILE *)anon_var_dwarf_f712;
    break;
  case 0xb:
    Pr.File = (FILE *)anon_var_dwarf_f6e8;
  }
  if (Pr.File == (FILE *)0x0) {
    fprintf(_stderr,"Caught signal %d\n",(ulong)(uint)Signum);
  }
  else {
    fprintf(_stderr,"Caught signal %d (%s)\n",(ulong)(uint)Signum,Pr.File);
  }
  printer::printer((printer *)local_30,(FILE *)_stderr);
  PrintStacktrace((printer *)local_30);
  exit(Signum);
}

Assistant:

void
AbortHandler(int Signum)
{
  cstr Name = nullptr;
  switch (Signum)
  {
    case SIGABRT:
      Name = "SIGABRT";
      break;
    case SIGSEGV:
      Name = "SIGSEGV";
      break;
#if !defined(_WIN32)
    case SIGBUS:
      Name = "SIGBUS";
      break;
#endif
    case SIGILL:
      Name = "SIGILL";
      break;
    case SIGFPE:
      Name = "SIGFPE";
      break;
  };
  if (Name)
    fprintf(stderr, "Caught signal %d (%s)\n", Signum, Name);
  else
    fprintf(stderr, "Caught signal %d\n", Signum);

  printer Pr(stderr);
  PrintStacktrace(&Pr);
  exit(Signum);
}